

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

uint HUF_optimalTableLog(uint maxTableLog,size_t srcSize,uint maxSymbolValue,void *workSpace,
                        size_t wkspSize,HUF_CElt *table,uint *count,int flags)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint local_60;
  
  if (srcSize < 2) {
    __assert_fail("srcSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3fbc,
                  "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
                 );
  }
  if (wkspSize < 0x1300) {
    __assert_fail("wkspSize >= sizeof(HUF_buildCTable_wksp_tables)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3fbd,
                  "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
                 );
  }
  if ((flags & 2U) == 0) {
    uVar1 = FSE_optimalTableLog_internal(maxTableLog,srcSize,maxSymbolValue,1);
    return uVar1;
  }
  uVar3 = 0;
  uVar1 = maxSymbolValue + 1;
  if (uVar1 != 0) {
    uVar6 = 0;
    uVar3 = 0;
    do {
      uVar3 = (uVar3 + 1) - (uint)(count[uVar6] == 0);
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  uVar5 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar3 = (uVar5 ^ 0xffffffe0) + 0x21;
  local_60 = maxTableLog;
  if (uVar3 <= maxTableLog) {
    uVar6 = 0xfffffffffffffffe;
    uVar5 = uVar3;
    do {
      sVar2 = HUF_buildCTable_wksp(table,count,maxSymbolValue,uVar5,workSpace,wkspSize);
      if (sVar2 < 0xffffffffffffff89) {
        if (sVar2 < uVar5 && uVar3 < uVar5) break;
        sVar2 = HUF_writeCTable_wksp
                          ((void *)((long)workSpace + 0x2ec),wkspSize - 0x2ec,table,maxSymbolValue,
                           (uint)sVar2,workSpace,wkspSize);
        if (sVar2 < 0xffffffffffffff89) {
          if ((int)maxSymbolValue < 0) {
            uVar4 = 0;
          }
          else {
            uVar7 = 0;
            uVar4 = 0;
            do {
              uVar4 = uVar4 + (ulong)count[uVar7] * (ulong)(byte)table[uVar7 + 1];
              uVar7 = uVar7 + 1;
            } while (uVar1 != uVar7);
            uVar4 = uVar4 >> 3;
          }
          uVar4 = uVar4 + sVar2;
          if (uVar6 + 1 < uVar4) break;
          if (uVar4 < uVar6) {
            uVar6 = uVar4;
            local_60 = uVar5;
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 <= maxTableLog);
  }
  if (local_60 < 0xd) {
    return local_60;
  }
  __assert_fail("optLog <= HUF_TABLELOG_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x3fe5,
                "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
               );
}

Assistant:

unsigned HUF_optimalTableLog(
            unsigned maxTableLog,
            size_t srcSize,
            unsigned maxSymbolValue,
            void* workSpace, size_t wkspSize,
            HUF_CElt* table,
      const unsigned* count,
            int flags)
{
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    assert(wkspSize >= sizeof(HUF_buildCTable_wksp_tables));

    if (!(flags & HUF_flags_optimalDepth)) {
        /* cheap evaluation, based on FSE */
        return FSE_optimalTableLog_internal(maxTableLog, srcSize, maxSymbolValue, 1);
    }

    {   BYTE* dst = (BYTE*)workSpace + sizeof(HUF_WriteCTableWksp);
        size_t dstSize = wkspSize - sizeof(HUF_WriteCTableWksp);
        size_t maxBits, hSize, newSize;
        const unsigned symbolCardinality = HUF_cardinality(count, maxSymbolValue);
        const unsigned minTableLog = HUF_minTableLog(symbolCardinality);
        size_t optSize = ((size_t) ~0) - 1;
        unsigned optLog = maxTableLog, optLogGuess;

        DEBUGLOG(6, "HUF_optimalTableLog: probing huf depth (srcSize=%zu)", srcSize);

        /* Search until size increases */
        for (optLogGuess = minTableLog; optLogGuess <= maxTableLog; optLogGuess++) {
            DEBUGLOG(7, "checking for huffLog=%u", optLogGuess);
            maxBits = HUF_buildCTable_wksp(table, count, maxSymbolValue, optLogGuess, workSpace, wkspSize);
            if (ERR_isError(maxBits)) continue;

            if (maxBits < optLogGuess && optLogGuess > minTableLog) break;

            hSize = HUF_writeCTable_wksp(dst, dstSize, table, maxSymbolValue, (U32)maxBits, workSpace, wkspSize);

            if (ERR_isError(hSize)) continue;

            newSize = HUF_estimateCompressedSize(table, count, maxSymbolValue) + hSize;

            if (newSize > optSize + 1) {
                break;
            }

            if (newSize < optSize) {
                optSize = newSize;
                optLog = optLogGuess;
            }
        }
        assert(optLog <= HUF_TABLELOG_MAX);
        return optLog;
    }
}